

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O1

Expression * __thiscall
wasm::SExpressionWasmBuilder::makeCallRef(SExpressionWasmBuilder *this,Element *s,bool isReturn)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  Element *pEVar6;
  List *pLVar7;
  Expression *target;
  CallRef *pCVar8;
  string *psVar9;
  long *plVar10;
  pointer puVar11;
  char *pcVar12;
  char *pcVar13;
  Signature SVar14;
  Builder local_98 [2];
  pointer local_78;
  pointer local_70;
  __uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> local_68;
  pointer puStack_60;
  pointer puStack_58;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  HeapType local_38;
  HeapType sigType;
  
  pEVar6 = Element::operator[](s,1);
  local_38 = parseHeapType(this,pEVar6);
  puStack_58 = (pointer)0x0;
  operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar7 = Element::list(s);
  parseOperands<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            (this,s,2,(int)(pLVar7->
                           super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
                           usedElements - 1,
             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
             &stack0xffffffffffffffa8);
  pLVar7 = Element::list(s);
  pEVar6 = Element::operator[](s,(int)(pLVar7->
                                      super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>
                                      ).usedElements - 1);
  target = parseExpression(this,pEVar6);
  bVar5 = HeapType::isSignature(&stack0xffffffffffffffc8);
  if (bVar5) {
    local_98[0].wasm = this->wasm;
    SVar14 = HeapType::getSignature(&stack0xffffffffffffffc8);
    pCVar8 = Builder::makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                       (local_98,target,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        &stack0xffffffffffffffa8,SVar14.results.id,isReturn);
    if (puStack_58 != (pointer)0x0) {
      operator_delete(puStack_58,
                      (long)operands.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puStack_58);
    }
    return (Expression *)pCVar8;
  }
  pcVar13 = "call_ref";
  if (isReturn) {
    pcVar13 = "return_call_ref";
  }
  pcVar12 = pcVar13 + 8;
  if (isReturn) {
    pcVar12 = pcVar13 + 0xf;
  }
  psVar9 = (string *)__cxa_allocate_exception(0x30);
  local_98[0].wasm = (Module *)&stack0xffffffffffffff78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,pcVar13,pcVar12);
  plVar10 = (long *)std::__cxx11::string::append((char *)local_98);
  local_78 = (pointer)*plVar10;
  puVar11 = (pointer)(plVar10 + 2);
  if (local_78 == puVar11) {
    local_68._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
         (tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)
         (puVar11->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    puStack_60 = (pointer)plVar10[3];
    local_78 = (pointer)&stack0xffffffffffffff98;
  }
  else {
    local_68._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
         (tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)
         (puVar11->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
  }
  local_70 = (pointer)plVar10[1];
  *plVar10 = (long)puVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  sVar3 = s->line;
  uVar1 = *(undefined4 *)((long)&s->line + 4);
  sVar4 = s->col;
  uVar2 = *(undefined4 *)((long)&s->col + 4);
  *(string **)psVar9 = psVar9 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            (psVar9,local_78,
             (undefined1 *)
             ((long)&(local_70->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl +
             (long)&(local_78->_M_t).
                    super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                    super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl));
  *(int *)(psVar9 + 0x20) = (int)sVar3;
  *(undefined4 *)(psVar9 + 0x24) = uVar1;
  *(int *)(psVar9 + 0x28) = (int)sVar4;
  *(undefined4 *)(psVar9 + 0x2c) = uVar2;
  __cxa_throw(psVar9,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

Expression* SExpressionWasmBuilder::makeCallRef(Element& s, bool isReturn) {
  HeapType sigType = parseHeapType(*s[1]);
  std::vector<Expression*> operands;
  parseOperands(s, 2, s.size() - 1, operands);
  auto* target = parseExpression(s[s.size() - 1]);

  if (!sigType.isSignature()) {
    throw ParseException(
      std::string(isReturn ? "return_call_ref" : "call_ref") +
        " type annotation should be a signature",
      s.line,
      s.col);
  }
  return Builder(wasm).makeCallRef(
    target, operands, sigType.getSignature().results, isReturn);
}